

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

bool __thiscall llvm::detail::DoubleAPFloat::isDenormal(DoubleAPFloat *this)

{
  APFloat *pAVar1;
  APFloat *pAVar2;
  bool bVar3;
  cmpResult cVar4;
  bool bVar5;
  APFloat Result;
  undefined1 auStack_38 [8];
  IEEEFloat local_30;
  
  pAVar1 = (this->Floats)._M_t.
           super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
           super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
           super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
  pAVar2 = (APFloat *)(pAVar1->U).IEEE.significand.part;
  if ((pAVar1->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
    pAVar2 = pAVar1;
  }
  if ((*(undefined1 *)((long)&pAVar2->U + 0x12) & 7) == 2) {
    bVar3 = APFloat::isDenormal(pAVar1);
    bVar5 = true;
    if (!bVar3) {
      bVar3 = APFloat::isDenormal((this->Floats)._M_t.
                                  super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                                  .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1);
      if (!bVar3) {
        pAVar1 = (this->Floats)._M_t.
                 super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                 super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                 super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
        if ((pAVar1->U).semantics == (fltSemantics *)semPPCDoubleDouble) {
          DoubleAPFloat((DoubleAPFloat *)(auStack_38 + 8),(DoubleAPFloat *)&(pAVar1->U).IEEE);
        }
        else {
          IEEEFloat::IEEEFloat((IEEEFloat *)(auStack_38 + 8),&(pAVar1->U).IEEE);
        }
        APFloat::add((APFloat *)auStack_38,pAVar1 + 1,rmNearestTiesToEven);
        cVar4 = APFloat::compare(pAVar1,(APFloat *)auStack_38);
        bVar5 = cVar4 != cmpEqual;
        bVar3 = true;
        goto LAB_00176106;
      }
    }
    bVar3 = false;
  }
  else {
    bVar3 = false;
    bVar5 = false;
  }
LAB_00176106:
  if (bVar3) {
    APFloat::Storage::~Storage((Storage *)(auStack_38 + 8));
  }
  return bVar5;
}

Assistant:

bool DoubleAPFloat::isDenormal() const {
  return getCategory() == fcNormal &&
         (Floats[0].isDenormal() || Floats[1].isDenormal() ||
          // (double)(Hi + Lo) == Hi defines a normal number.
          Floats[0].compare(Floats[0] + Floats[1]) != cmpEqual);
}